

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_context.c
# Opt level: O2

GLFWbool chooseEGLConfig(_GLFWctxconfig *ctxconfig,_GLFWfbconfig *desired,EGLConfig *result)

{
  EGLConfig config;
  int iVar1;
  uint uVar2;
  GLFWbool GVar3;
  EGLConfig *__ptr;
  undefined8 *puVar4;
  _GLFWfbconfig *p_Var5;
  long lVar6;
  uint uVar7;
  int nativeCount;
  _GLFWfbconfig *local_a0;
  _GLFWfbconfig *local_98;
  _GLFWctxconfig *local_90;
  EGLConfig *local_88;
  int count;
  XVisualInfo vi;
  
  uVar7 = 0;
  local_98 = desired;
  local_90 = ctxconfig;
  (*_glfw.egl.GetConfigs)(_glfw.egl.display,(EGLConfig *)0x0,0,&nativeCount);
  iVar1 = nativeCount;
  if ((long)nativeCount == 0) {
    uVar7 = 0;
    _glfwInputError(0x10006,"EGL: No EGLConfigs returned");
  }
  else {
    local_88 = result;
    __ptr = (EGLConfig *)calloc((long)nativeCount,8);
    (*_glfw.egl.GetConfigs)(_glfw.egl.display,__ptr,iVar1,&nativeCount);
    iVar1 = nativeCount;
    local_a0 = (_GLFWfbconfig *)calloc((long)nativeCount,0x48);
    for (lVar6 = 0; lVar6 < iVar1; lVar6 = lVar6 + 1) {
      config = __ptr[lVar6];
      iVar1 = getEGLConfigAttrib(config,0x303f);
      if ((iVar1 == 0x308e) && (uVar2 = getEGLConfigAttrib(config,0x3033), (uVar2 & 4) != 0)) {
        vi.blue_mask = 0;
        vi.colormap_size = 0;
        vi.bits_per_rgb = 0;
        vi.red_mask = 0;
        vi.green_mask = 0;
        vi.screen = 0;
        vi.depth = 0;
        vi.class = 0;
        vi._28_4_ = 0;
        vi.visual = (Visual *)0x0;
        vi.visualid = 0;
        iVar1 = getEGLConfigAttrib(config,0x302e);
        vi.visualid = (VisualID)iVar1;
        if (iVar1 != 0) {
          p_Var5 = local_a0 + (int)uVar7;
          if ((local_98->transparent != 0) &&
             (puVar4 = (undefined8 *)XGetVisualInfo(_glfw.x11.display,1,&vi,&count),
             puVar4 != (undefined8 *)0x0)) {
            GVar3 = _glfwIsVisualTransparentX11((Visual *)*puVar4);
            p_Var5->transparent = GVar3;
            XFree(puVar4);
          }
          if (local_90->client == 0x30001) {
            uVar2 = getEGLConfigAttrib(config,0x3040);
            uVar2 = uVar2 & 8;
joined_r0x001606b0:
            if (uVar2 == 0) goto LAB_001606a2;
          }
          else if (local_90->client == 0x30002) {
            iVar1 = local_90->major;
            uVar2 = getEGLConfigAttrib(config,0x3040);
            if (iVar1 == 1) {
              uVar2 = uVar2 & 1;
            }
            else {
              uVar2 = uVar2 & 4;
            }
            goto joined_r0x001606b0;
          }
          iVar1 = getEGLConfigAttrib(config,0x3024);
          p_Var5->redBits = iVar1;
          iVar1 = getEGLConfigAttrib(config,0x3023);
          p_Var5->greenBits = iVar1;
          iVar1 = getEGLConfigAttrib(config,0x3022);
          p_Var5->blueBits = iVar1;
          iVar1 = getEGLConfigAttrib(config,0x3021);
          p_Var5->alphaBits = iVar1;
          iVar1 = getEGLConfigAttrib(config,0x3025);
          p_Var5->depthBits = iVar1;
          iVar1 = getEGLConfigAttrib(config,0x3026);
          p_Var5->stencilBits = iVar1;
          iVar1 = getEGLConfigAttrib(config,0x3031);
          p_Var5->samples = iVar1;
          p_Var5->doublebuffer = 1;
          p_Var5->handle = (uintptr_t)config;
          uVar7 = uVar7 + 1;
        }
      }
LAB_001606a2:
      iVar1 = nativeCount;
    }
    p_Var5 = _glfwChooseFBConfig(local_98,local_a0,uVar7);
    if (p_Var5 != (_GLFWfbconfig *)0x0) {
      *local_88 = (EGLConfig)p_Var5->handle;
    }
    uVar7 = (uint)(p_Var5 != (_GLFWfbconfig *)0x0);
    free(__ptr);
    free(local_a0);
  }
  return uVar7;
}

Assistant:

static GLFWbool chooseEGLConfig(const _GLFWctxconfig* ctxconfig,
                                const _GLFWfbconfig* desired,
                                EGLConfig* result)
{
    EGLConfig* nativeConfigs;
    _GLFWfbconfig* usableConfigs;
    const _GLFWfbconfig* closest;
    int i, nativeCount, usableCount;

    eglGetConfigs(_glfw.egl.display, NULL, 0, &nativeCount);
    if (!nativeCount)
    {
        _glfwInputError(GLFW_API_UNAVAILABLE, "EGL: No EGLConfigs returned");
        return GLFW_FALSE;
    }

    nativeConfigs = calloc(nativeCount, sizeof(EGLConfig));
    eglGetConfigs(_glfw.egl.display, nativeConfigs, nativeCount, &nativeCount);

    usableConfigs = calloc(nativeCount, sizeof(_GLFWfbconfig));
    usableCount = 0;

    for (i = 0;  i < nativeCount;  i++)
    {
        const EGLConfig n = nativeConfigs[i];
        _GLFWfbconfig* u = usableConfigs + usableCount;

        // Only consider RGB(A) EGLConfigs
        if (getEGLConfigAttrib(n, EGL_COLOR_BUFFER_TYPE) != EGL_RGB_BUFFER)
            continue;

        // Only consider window EGLConfigs
        if (!(getEGLConfigAttrib(n, EGL_SURFACE_TYPE) & EGL_WINDOW_BIT))
            continue;

#if defined(_GLFW_X11)
        XVisualInfo vi = {0};

        // Only consider EGLConfigs with associated Visuals
        vi.visualid = getEGLConfigAttrib(n, EGL_NATIVE_VISUAL_ID);
        if (!vi.visualid)
            continue;

        if (desired->transparent)
        {
            int count;
            XVisualInfo* vis = XGetVisualInfo(_glfw.x11.display,
                                              VisualIDMask, &vi,
                                              &count);
            if (vis)
            {
                u->transparent = _glfwIsVisualTransparentX11(vis[0].visual);
                XFree(vis);
            }
        }
#endif // _GLFW_X11

        if (ctxconfig->client == GLFW_OPENGL_ES_API)
        {
            if (ctxconfig->major == 1)
            {
                if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_ES_BIT))
                    continue;
            }
            else
            {
                if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_ES2_BIT))
                    continue;
            }
        }
        else if (ctxconfig->client == GLFW_OPENGL_API)
        {
            if (!(getEGLConfigAttrib(n, EGL_RENDERABLE_TYPE) & EGL_OPENGL_BIT))
                continue;
        }

        u->redBits = getEGLConfigAttrib(n, EGL_RED_SIZE);
        u->greenBits = getEGLConfigAttrib(n, EGL_GREEN_SIZE);
        u->blueBits = getEGLConfigAttrib(n, EGL_BLUE_SIZE);

        u->alphaBits = getEGLConfigAttrib(n, EGL_ALPHA_SIZE);
        u->depthBits = getEGLConfigAttrib(n, EGL_DEPTH_SIZE);
        u->stencilBits = getEGLConfigAttrib(n, EGL_STENCIL_SIZE);

        u->samples = getEGLConfigAttrib(n, EGL_SAMPLES);
        u->doublebuffer = GLFW_TRUE;

        u->handle = (uintptr_t) n;
        usableCount++;
    }

    closest = _glfwChooseFBConfig(desired, usableConfigs, usableCount);
    if (closest)
        *result = (EGLConfig) closest->handle;

    free(nativeConfigs);
    free(usableConfigs);

    return closest != NULL;
}